

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

void flatbuffers::anon_unknown_0::SwapSerializedTables
               (Offset<flatbuffers::Table> *a,Offset<flatbuffers::Table> *b)

{
  offset_type oVar1;
  int iVar2;
  offset_type oVar3;
  
  if (-1 < (long)b - (long)a) {
    iVar2 = (int)((long)b - (long)a);
    a->o = a->o - iVar2;
    oVar3 = iVar2 + b->o;
    b->o = oVar3;
    oVar1 = a->o;
    a->o = oVar3;
    b->o = oVar1;
    return;
  }
  __assert_fail("diff >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0x106,
                "void flatbuffers::(anonymous namespace)::SwapSerializedTables(Offset<Table> *, Offset<Table> *)"
               );
}

Assistant:

static void SwapSerializedTables(Offset<Table> *a, Offset<Table> *b) {
  // These are serialized offsets, so are relative where they are
  // stored in memory, so compute the distance between these pointers:
  ptrdiff_t diff = (b - a) * sizeof(Offset<Table>);
  FLATBUFFERS_ASSERT(diff >= 0);  // Guaranteed by SimpleQsort.
  auto udiff = static_cast<uoffset_t>(diff);
  a->o = EndianScalar(ReadScalar<uoffset_t>(a) - udiff);
  b->o = EndianScalar(ReadScalar<uoffset_t>(b) + udiff);
  std::swap(*a, *b);
}